

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O2

int64_t GetVirtualTransactionSize(CTransaction *tx,int64_t nSigOpCost,uint bytes_per_sigop)

{
  long lVar1;
  int32_t iVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = GetTransactionWeight(tx);
  lVar4 = (long)iVar2;
  lVar3 = (ulong)bytes_per_sigop * nSigOpCost;
  if (lVar3 - lVar4 == 0 || lVar3 < lVar4) {
    lVar3 = lVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (lVar3 + 3) / 4;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetVirtualTransactionSize(const CTransaction& tx, int64_t nSigOpCost, unsigned int bytes_per_sigop)
{
    return GetVirtualTransactionSize(GetTransactionWeight(tx), nSigOpCost, bytes_per_sigop);
}